

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O2

void __thiscall QTimer::start(QTimer *this)

{
  QObjectData *pQVar1;
  parameter_type timerType;
  int iVar2;
  duration<long,_std::ratio<1L,_1000L>_> dVar3;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (0 < (int)pQVar1[1].children.d.size) {
    stop(this);
  }
  local_28.__r = 1;
  dVar3 = std::chrono::
          operator*<long,_std::ratio<1L,_1000L>,_QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>_>
                    (&local_28,
                     (QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
                      *)((long)&pQVar1[1].children.d.size + 4));
  timerType = QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>
              ::value((QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>
                       *)((long)&pQVar1[1].metaObject + 4));
  iVar2 = QObject::startTimer(&this->super_QObject,(nanoseconds)(dVar3.__r * 1000000),timerType);
  if (0 < iVar2) {
    *(int *)&pQVar1[1].children.d.size = iVar2;
    QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>
    ::notify((QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>
              *)&pQVar1[1].bindingStorage);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimer::start()
{
    Q_D(QTimer);
    if (d->isActive()) // stop running timer
        stop();

    Qt::TimerId newId{ QObject::startTimer(d->inter * 1ms, d->type) }; // overflow impossible
    if (newId > Qt::TimerId::Invalid) {
        d->id = newId;
        d->isActiveData.notify();
    }
}